

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeGetNumMassSetups(void *arkode_mem,long *nmsetups)

{
  int iVar1;
  ARKLsMassMem in_RAX;
  ARKLsMassMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x770,"ARKodeGetNumMassSetups",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
      *nmsetups = 0;
    }
    else {
      arkls_mem = in_RAX;
      iVar1 = arkLs_AccessMassMem((ARKodeMem)arkode_mem,"ARKodeGetNumMassSetups",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      *nmsetups = arkls_mem->nmsetups;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumMassSetups(void* arkode_mem, long int* nmsetups)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *nmsetups = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *nmsetups = arkls_mem->nmsetups;
  return (ARKLS_SUCCESS);
}